

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_seckey_tweak_mul(secp256k1_context *ctx,uchar *seckey,uchar *tweak32)

{
  uint uVar1;
  void *pvVar2;
  char *pcVar3;
  int overflow;
  secp256k1_scalar local_30;
  secp256k1_scalar local_2c;
  
  overflow = 0;
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/secp256k1.c"
            ,0x2f6,"test condition failed: ctx != NULL");
    abort();
  }
  if (seckey == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "seckey != NULL";
  }
  else {
    if (tweak32 != (uchar *)0x0) {
      secp256k1_scalar_set_b32(&local_2c,tweak32,&overflow);
      uVar1 = secp256k1_scalar_set_b32_seckey(&local_30,seckey);
      local_30 = (local_30 * local_2c) % 0xd;
      if (local_2c == 0) {
        uVar1 = 0;
      }
      if (overflow != 0) {
        uVar1 = 0;
      }
      secp256k1_scalar_cmov(&local_30,&secp256k1_scalar_zero,uVar1 ^ 1);
      seckey[0xc] = '\0';
      seckey[0xd] = '\0';
      seckey[0xe] = '\0';
      seckey[0xf] = '\0';
      seckey[0x10] = '\0';
      seckey[0x11] = '\0';
      seckey[0x12] = '\0';
      seckey[0x13] = '\0';
      seckey[0x14] = '\0';
      seckey[0x15] = '\0';
      seckey[0x16] = '\0';
      seckey[0x17] = '\0';
      seckey[0x18] = '\0';
      seckey[0x19] = '\0';
      seckey[0x1a] = '\0';
      seckey[0x1b] = '\0';
      seckey[0] = '\0';
      seckey[1] = '\0';
      seckey[2] = '\0';
      seckey[3] = '\0';
      seckey[4] = '\0';
      seckey[5] = '\0';
      seckey[6] = '\0';
      seckey[7] = '\0';
      seckey[8] = '\0';
      seckey[9] = '\0';
      seckey[10] = '\0';
      seckey[0xb] = '\0';
      seckey[0xc] = '\0';
      seckey[0xd] = '\0';
      seckey[0xe] = '\0';
      seckey[0xf] = '\0';
      *(secp256k1_scalar *)(seckey + 0x1c) =
           local_30 >> 0x18 | (local_30 & 0xff0000) >> 8 | (local_30 & 0xff00) << 8 |
           local_30 << 0x18;
      return uVar1;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "tweak32 != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_ec_seckey_tweak_mul(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak32) {
    secp256k1_scalar factor;
    secp256k1_scalar sec;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak32 != NULL);

    secp256k1_scalar_set_b32(&factor, tweak32, &overflow);
    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    ret &= (!overflow) & secp256k1_eckey_privkey_tweak_mul(&sec, &factor);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_clear(&factor);
    return ret;
}